

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_blocks
          (crn_comp *this,uint group,bool clear_histograms,symbol_codec *pCodec,
          vector<unsigned_short> *pColor_endpoint_remap,
          vector<unsigned_short> *pColor_selector_remap,
          vector<unsigned_short> *pAlpha_endpoint_remap,
          vector<unsigned_short> *pAlpha_selector_remap)

{
  uint8 uVar1;
  uint8 uVar2;
  ushort uVar3;
  uint uVar4;
  vector<unsigned_short> *pvVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  level_details *plVar11;
  endpoint_indices_details *peVar12;
  unsigned_short *puVar13;
  selector_indices_details *psVar14;
  bool bVar15;
  bool bVar16;
  bool local_ed;
  vector<unsigned_short> *local_e8;
  vector<unsigned_short> *local_e0;
  uint index_1;
  uint cEnd_1;
  uint c_2;
  int sym;
  uint index;
  uint cEnd;
  uint c_1;
  uint8 reference_group;
  bool secondary_etc_subblock;
  uint bx;
  uint bEnd;
  uint b;
  uint by;
  uint block_width;
  uint c;
  vector<unsigned_short> *selector_remap [3];
  vector<unsigned_short> *local_58;
  vector<unsigned_short> *endpoint_remap [3];
  uint endpoint_index [3];
  vector<unsigned_short> *pColor_selector_remap_local;
  vector<unsigned_short> *pColor_endpoint_remap_local;
  symbol_codec *pCodec_local;
  bool clear_histograms_local;
  uint group_local;
  crn_comp *this_local;
  
  if (pCodec == (symbol_codec *)0x0) {
    symbol_histogram::resize(&this->m_reference_hist,0x100);
    if (clear_histograms) {
      symbol_histogram::set_all(&this->m_reference_hist,0);
    }
    if (pColor_endpoint_remap != (vector<unsigned_short> *)0x0) {
      uVar8 = vector<unsigned_short>::size(pColor_endpoint_remap);
      symbol_histogram::resize(this->m_endpoint_index_hist,uVar8);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_endpoint_index_hist,0);
      }
    }
    if (pColor_selector_remap != (vector<unsigned_short> *)0x0) {
      uVar8 = vector<unsigned_short>::size(pColor_selector_remap);
      symbol_histogram::resize(this->m_selector_index_hist,uVar8);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_selector_index_hist,0);
      }
    }
    if (pAlpha_endpoint_remap != (vector<unsigned_short> *)0x0) {
      uVar8 = vector<unsigned_short>::size(pAlpha_endpoint_remap);
      symbol_histogram::resize(this->m_endpoint_index_hist + 1,uVar8);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_endpoint_index_hist + 1,0);
      }
    }
    if (pAlpha_selector_remap != (vector<unsigned_short> *)0x0) {
      uVar8 = vector<unsigned_short>::size(pAlpha_selector_remap);
      symbol_histogram::resize(this->m_selector_index_hist + 1,uVar8);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_selector_index_hist + 1,0);
      }
    }
  }
  memset((void *)((long)endpoint_remap + 0x14),0,0xc);
  memset(&local_58,0,0x18);
  memset(&block_width,0,0x18);
  for (by = 0; by < 3; by = by + 1) {
    if ((this->m_has_comp[by] & 1U) != 0) {
      local_e0 = pColor_endpoint_remap;
      if (by != 0) {
        local_e0 = pAlpha_endpoint_remap;
      }
      endpoint_remap[(ulong)by - 1] = local_e0;
      local_e8 = pColor_selector_remap;
      if (by != 0) {
        local_e8 = pAlpha_selector_remap;
      }
      *(vector<unsigned_short> **)(&block_width + (ulong)by * 2) = local_e8;
    }
  }
  plVar11 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,group);
  uVar4 = plVar11->block_width;
  bVar6 = false;
  plVar11 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,group);
  bx = plVar11->first_block;
  plVar11 = vector<crnlib::crn_comp::level_details>::operator[](&this->m_levels,group);
  uVar9 = bx + plVar11->num_blocks;
  while (bx < uVar9) {
    for (c_1 = 0; c_1 < uVar4; c_1 = c_1 + 1) {
      bVar15 = (this->m_has_subblocks & 1U) != 0;
      bVar16 = (c_1 & 1) != 0;
      local_ed = bVar15 && bVar16;
      if ((!bVar6) && ((c_1 & 1) == 0)) {
        peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                            (&this->m_endpoint_indices,bx);
        bVar7 = peVar12->reference;
        peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                            (&this->m_endpoint_indices,bx + uVar4);
        uVar1 = peVar12->reference;
        peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                            (&this->m_endpoint_indices,bx + 1);
        uVar2 = peVar12->reference;
        peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                            (&this->m_endpoint_indices,bx + uVar4 + 1);
        bVar7 = bVar7 | uVar1 << 2 | uVar2 << 4 | peVar12->reference << 6;
        if (pCodec == (symbol_codec *)0x0) {
          symbol_histogram::inc_freq(&this->m_reference_hist,(uint)bVar7,1);
        }
        else {
          symbol_codec::encode(pCodec,(uint)bVar7,&this->m_reference_dm);
        }
      }
      index = 0;
      uVar10 = 3;
      if (bVar15 && bVar16) {
        uVar10 = 1;
      }
      for (; index < uVar10; index = index + 1) {
        if (endpoint_remap[(ulong)index - 1] != (vector<unsigned_short> *)0x0) {
          pvVar5 = endpoint_remap[(ulong)index - 1];
          peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                              (&this->m_endpoint_indices,bx);
          puVar13 = vector<unsigned_short>::operator[]
                              (pvVar5,(uint)(peVar12->field_0).component[index]);
          uVar3 = *puVar13;
          if (bVar15 && bVar16) {
            peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                (&this->m_endpoint_indices,bx);
            bVar7 = peVar12->reference;
          }
          else {
            peVar12 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                                (&this->m_endpoint_indices,bx);
            bVar7 = (peVar12->reference != '\0' ^ 0xffU) & 1;
          }
          if (bVar7 != 0) {
            cEnd_1 = (uint)uVar3 - *(int *)((long)endpoint_remap + (ulong)index * 4 + 0x14);
            if ((int)cEnd_1 < 0) {
              uVar8 = vector<unsigned_short>::size(endpoint_remap[(ulong)index - 1]);
              cEnd_1 = uVar8 + cEnd_1;
            }
            if (pCodec == (symbol_codec *)0x0) {
              symbol_histogram::inc_freq
                        (this->m_endpoint_index_hist + (int)(uint)(index != 0),cEnd_1,1);
            }
            else {
              symbol_codec::encode
                        (pCodec,cEnd_1,
                         (static_huffman_data_model *)
                         ((long)this->m_endpoint_index_hist +
                         (long)(int)(uint)(index != 0) * 0x38 + 0x20));
            }
          }
          *(uint *)((long)endpoint_remap + (ulong)index * 4 + 0x14) = (uint)uVar3;
        }
      }
      index_1 = 0;
      uVar10 = 3;
      if (local_ed) {
        uVar10 = 0;
      }
      for (; index_1 < uVar10; index_1 = index_1 + 1) {
        if (*(long *)(&block_width + (ulong)index_1 * 2) != 0) {
          pvVar5 = *(vector<unsigned_short> **)(&block_width + (ulong)index_1 * 2);
          psVar14 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                              (&this->m_selector_indices,bx);
          puVar13 = vector<unsigned_short>::operator[]
                              (pvVar5,(uint)(psVar14->field_0).component[index_1]);
          if (pCodec == (symbol_codec *)0x0) {
            symbol_histogram::inc_freq
                      (this->m_selector_index_hist + (int)(uint)(index_1 != 0),(uint)*puVar13,1);
          }
          else {
            symbol_codec::encode
                      (pCodec,(uint)*puVar13,
                       (static_huffman_data_model *)
                       ((long)this->m_selector_index_hist +
                       (long)(int)(uint)(index_1 != 0) * 0x38 + 0x20));
          }
        }
      }
      bx = bx + 1;
    }
    bVar6 = (bool)(bVar6 ^ 1);
  }
  return true;
}

Assistant:

bool crn_comp::pack_blocks(
        uint group,
        bool clear_histograms,
        symbol_codec* pCodec,
        const crnlib::vector<uint16>* pColor_endpoint_remap,
        const crnlib::vector<uint16>* pColor_selector_remap,
        const crnlib::vector<uint16>* pAlpha_endpoint_remap,
        const crnlib::vector<uint16>* pAlpha_selector_remap)
    {
        if (!pCodec)
        {
            m_reference_hist.resize(256);
            if (clear_histograms)
            {
                m_reference_hist.set_all(0);
            }

            if (pColor_endpoint_remap)
            {
                m_endpoint_index_hist[0].resize(pColor_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[0].set_all(0);
                }
            }

            if (pColor_selector_remap)
            {
                m_selector_index_hist[0].resize(pColor_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[0].set_all(0);
                }
            }

            if (pAlpha_endpoint_remap)
            {
                m_endpoint_index_hist[1].resize(pAlpha_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[1].set_all(0);
                }
            }

            if (pAlpha_selector_remap)
            {
                m_selector_index_hist[1].resize(pAlpha_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[1].set_all(0);
                }
            }
        }

        uint endpoint_index[cNumComps] = {};
        const crnlib::vector<uint16>* endpoint_remap[cNumComps] = {};
        const crnlib::vector<uint16>* selector_remap[cNumComps] = {};
        for (uint c = 0; c < cNumComps; c++)
        {
            if (m_has_comp[c])
            {
                endpoint_remap[c] = c ? pAlpha_endpoint_remap : pColor_endpoint_remap;
                selector_remap[c] = c ? pAlpha_selector_remap : pColor_selector_remap;
            }
        }

        uint block_width = m_levels[group].block_width;
        for (uint by = 0, b = m_levels[group].first_block, bEnd = b + m_levels[group].num_blocks; b < bEnd; by++)
        {
            for (uint bx = 0; bx < block_width; bx++, b++)
            {
                const bool secondary_etc_subblock = m_has_subblocks && bx & 1;
                if (!(by & 1) && !(bx & 1))
                {
                    uint8 reference_group = m_endpoint_indices[b].reference | m_endpoint_indices[b + block_width].reference << 2 |
                        m_endpoint_indices[b + 1].reference << 4 | m_endpoint_indices[b + block_width + 1].reference << 6;
                    if (pCodec)
                    {
                        pCodec->encode(reference_group, m_reference_dm);
                    }
                    else
                    {
                        m_reference_hist.inc_freq(reference_group);
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? cAlpha0 : cNumComps; c < cEnd; c++)
                {
                    if (endpoint_remap[c])
                    {
                        uint index = (*endpoint_remap[c])[m_endpoint_indices[b].component[c]];
                        if (secondary_etc_subblock ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference)
                        {
                            int sym = index - endpoint_index[c];
                            if (sym < 0)
                            {
                                sym += endpoint_remap[c]->size();
                            }
                            if (!pCodec)
                            {
                                m_endpoint_index_hist[c ? 1 : 0].inc_freq(sym);
                            }
                            else
                            {
                                pCodec->encode(sym, m_endpoint_index_dm[c ? 1 : 0]);
                            }
                        }
                        endpoint_index[c] = index;
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? 0 : cNumComps; c < cEnd; c++)
                {
                    if (selector_remap[c])
                    {
                        uint index = (*selector_remap[c])[m_selector_indices[b].component[c]];
                        if (!pCodec)
                        {
                            m_selector_index_hist[c ? 1 : 0].inc_freq(index);
                        }
                        else
                        {
                            pCodec->encode(index, m_selector_index_dm[c ? 1 : 0]);
                        }
                    }
                }
            }
        }
        return true;
    }